

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

Object<(anonymous_namespace)::Version> * __thiscall
cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::
Bind<(anonymous_namespace)::Version,int,std::function<cmCTestResourceSpec::ReadFileResult(int&,Json::Value_const*)>>
          (Object<(anonymous_namespace)::Version> *this,string_view *name,
          offset_in_Version_to_int member,
          function<cmCTestResourceSpec::ReadFileResult_(int_&,_const_Json::Value_*)> *func,
          bool required)

{
  pointer *ppMVar1;
  pointer this_00;
  ulong uVar2;
  pointer __result;
  pointer pMVar3;
  pointer pMVar4;
  ulong uVar5;
  _Tp_alloc_type *__alloc;
  Member *__args;
  Member *__args_00;
  _Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  *this_01;
  long lVar6;
  _Any_data local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  pointer local_c8;
  _Any_data local_c0;
  long local_b0;
  undefined8 uStack_a8;
  offset_in_Version_to_int local_a0;
  Member local_98;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  std::function<cmCTestResourceSpec::ReadFileResult_(int_&,_const_Json::Value_*)>::function
            ((function<cmCTestResourceSpec::ReadFileResult_(int_&,_const_Json::Value_*)> *)&local_c0
             ,func);
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_a0 = member;
  local_e8._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_e8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_e8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_e8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_e8._M_unused._0_8_ + 0x18) = uStack_a8;
  if (local_b0 != 0) {
    *(void **)local_e8._M_unused._0_8_ = local_c0._M_unused._M_object;
    *(undefined8 *)((long)local_e8._M_unused._0_8_ + 8) = local_c0._8_8_;
    *(long *)((long)local_e8._M_unused._0_8_ + 0x10) = local_b0;
    local_b0 = 0;
    uStack_a8 = 0;
  }
  *(offset_in_Version_to_int *)((long)local_e8._M_unused._0_8_ + 0x20) = member;
  local_98.Name._M_len = name->_M_len;
  local_98.Name._M_str = name->_M_str;
  local_d8 = 0;
  uStack_d0 = 0;
  local_98.Function.super__Function_base._M_functor._8_8_ = local_e8._8_8_;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_98.Function.super__Function_base._M_manager =
       std::
       _Function_handler<cmCTestResourceSpec::ReadFileResult_((anonymous_namespace)::Version_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
       ::_M_manager;
  local_98.Function._M_invoker =
       std::
       _Function_handler<cmCTestResourceSpec::ReadFileResult_((anonymous_namespace)::Version_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
       ::_M_invoke;
  local_98.Function.super__Function_base._M_functor._M_unused._0_8_ = local_e8._M_unused._M_object;
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  local_98.Required = true;
  pMVar4 = (this->Members).
           super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar4 == (this->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_c8 = (this->Members).
               super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
               ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)pMVar4 - (long)local_c8;
    if (lVar6 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar2 = lVar6 / 0x38;
    uVar5 = 1;
    if (pMVar4 != local_c8) {
      uVar5 = uVar2;
    }
    this_01 = (_Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
               *)(uVar5 + uVar2);
    if ((_Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
         *)0x249249249249248 < this_01) {
      this_01 = (_Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                 *)0x249249249249249;
    }
    __alloc = (_Tp_alloc_type *)(uVar5 + uVar2);
    if (CARRY8(uVar5,uVar2)) {
      this_01 = (_Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                 *)0x249249249249249;
    }
    __result = std::
               _Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
               ::_M_allocate(this_01,0x38);
    std::
    allocator_traits<std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>>
    ::
    construct<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>
              ((allocator_type *)(lVar6 + (long)__result),&local_98,__args_00);
    this_00 = local_c8;
    pMVar3 = std::
             vector<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
             ::_S_relocate(local_c8,pMVar4,__result,__alloc);
    pMVar4 = std::
             vector<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
             ::_S_relocate(pMVar4,pMVar4,pMVar3 + 1,__alloc);
    lVar6 = (long)(this->Members).
                  super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00;
    std::
    _Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
    ::_M_deallocate((_Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                     *)this_00,(pointer)(lVar6 / 0x38),lVar6 % 0x38);
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar4;
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_01;
  }
  else {
    std::
    allocator_traits<std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>>
    ::
    construct<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>
              ((allocator_type *)pMVar4,&local_98,__args);
    ppMVar1 = &(this->Members).
               super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  this->AnyRequired = true;
  std::_Function_base::~_Function_base(&local_98.Function.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_c0);
  return this;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }